

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationBuilder::findCommonNode(CollationBuilder *this,int32_t index,int32_t strength)

{
  char cVar1;
  UBool UVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int64_t node_00;
  bool bVar5;
  int64_t local_28;
  int64_t node;
  int32_t strength_local;
  int32_t index_local;
  CollationBuilder *this_local;
  
  node_00 = UVector64::elementAti(&this->nodes,index);
  iVar3 = strengthFromNode(node_00);
  this_local._4_4_ = index;
  if (iVar3 < strength) {
    if (strength == 1) {
      cVar1 = nodeHasBefore2(node_00);
    }
    else {
      cVar1 = nodeHasBefore3(node_00);
    }
    if (cVar1 != '\0') {
      iVar3 = nextIndexFromNode(node_00);
      local_28 = UVector64::elementAti(&this->nodes,iVar3);
      do {
        this_local._4_4_ = nextIndexFromNode(local_28);
        local_28 = UVector64::elementAti(&this->nodes,this_local._4_4_);
        UVar2 = isTailoredNode(local_28);
        bVar5 = true;
        if (UVar2 == '\0') {
          iVar3 = strengthFromNode(local_28);
          bVar5 = true;
          if (iVar3 <= strength) {
            uVar4 = weight16FromNode(local_28);
            bVar5 = uVar4 < 0x500;
          }
        }
      } while (bVar5);
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationBuilder::findCommonNode(int32_t index, int32_t strength) const {
    U_ASSERT(UCOL_SECONDARY <= strength && strength <= UCOL_TERTIARY);
    int64_t node = nodes.elementAti(index);
    if(strengthFromNode(node) >= strength) {
        // The current node is no stronger.
        return index;
    }
    if(strength == UCOL_SECONDARY ? !nodeHasBefore2(node) : !nodeHasBefore3(node)) {
        // The current node implies the strength-common weight.
        return index;
    }
    index = nextIndexFromNode(node);
    node = nodes.elementAti(index);
    U_ASSERT(!isTailoredNode(node) && strengthFromNode(node) == strength &&
            weight16FromNode(node) < Collation::COMMON_WEIGHT16);
    // Skip to the explicit common node.
    do {
        index = nextIndexFromNode(node);
        node = nodes.elementAti(index);
        U_ASSERT(strengthFromNode(node) >= strength);
    } while(isTailoredNode(node) || strengthFromNode(node) > strength ||
            weight16FromNode(node) < Collation::COMMON_WEIGHT16);
    U_ASSERT(weight16FromNode(node) == Collation::COMMON_WEIGHT16);
    return index;
}